

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O0

void __thiscall testing::Message::Message(Message *this,Message *msg)

{
  stringstream *this_00;
  String *str;
  Message *msg_local;
  Message *this_local;
  
  str = (String *)this;
  this_00 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this_00);
  internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::scoped_ptr(&this->ss_,
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator*((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)str);
  GetString((Message *)str);
  internal::operator<<((ostream *)this_00,str);
  internal::String::~String((String *)this);
  return;
}

Assistant:

Message(const Message& msg) : ss_(new ::std::stringstream) {  // NOLINT
    *ss_ << msg.GetString();
  }